

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

QPropertyAdaptorSlotObject * __thiscall
QObjectPrivate::getPropertyAdaptorSlotObject(QObjectPrivate *this,QMetaProperty *property)

{
  __pointer_type pCVar1;
  QSlotObjectBase *ptr;
  int iVar2;
  undefined4 extraout_var;
  QPropertyAdaptorSlotObject *pQVar3;
  int iVar4;
  __pointer_type pSVar5;
  long in_FS_OFFSET;
  QMetaObject *metaObject;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
           _M_b._M_p;
  if (pCVar1 != (__pointer_type)0x0) {
    iVar2 = (**((this->super_QObjectData).q_ptr)->_vptr_QObject)();
    metaObject = (QMetaObject *)CONCAT44(extraout_var,iVar2);
    iVar2 = QMetaProperty::notifySignalIndex(property);
    iVar2 = methodIndexToSignalIndex(&metaObject,iVar2);
    if ((pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b
        ._M_p == (__pointer_type)0x0) {
      iVar4 = -1;
    }
    else {
      iVar4 = (int)((pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>.
                    _q_value._M_b._M_p)->allocated;
    }
    if (iVar2 < iVar4) {
      pSVar5 = (pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>.
               _q_value._M_b._M_p + (long)iVar2 + 1;
      do {
        do {
          pSVar5 = *(__pointer_type *)&pSVar5[1].super_ConnectionOrSignalVector;
          if (pSVar5 == (__pointer_type)0x0) goto LAB_00290050;
        } while (((ulong)pSVar5[5].super_ConnectionOrSignalVector.field_0.next & 0x2000000000000000)
                 == 0);
        ptr = (QSlotObjectBase *)pSVar5[3].allocated;
        iVar2 = QMetaProperty::propertyIndex(property);
        pQVar3 = QtPrivate::QPropertyAdaptorSlotObject::cast(ptr,iVar2);
      } while (pQVar3 == (QPropertyAdaptorSlotObject *)0x0);
      goto LAB_00290052;
    }
  }
LAB_00290050:
  pQVar3 = (QPropertyAdaptorSlotObject *)0x0;
LAB_00290052:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QtPrivate::QPropertyAdaptorSlotObject *
QObjectPrivate::getPropertyAdaptorSlotObject(const QMetaProperty &property)
{
    if (auto conns = connections.loadAcquire()) {
        Q_Q(QObject);
        const QMetaObject *metaObject = q->metaObject();
        int signal_index = methodIndexToSignalIndex(&metaObject, property.notifySignalIndex());
        if (signal_index >= conns->signalVectorCount())
            return nullptr;
        const auto &connectionList = conns->connectionsForSignal(signal_index);
        for (auto c = connectionList.first.loadRelaxed(); c;
             c = c->nextConnectionList.loadRelaxed()) {
            if (c->isSlotObject) {
                if (auto p = QtPrivate::QPropertyAdaptorSlotObject::cast(c->slotObj,
                                                                         property.propertyIndex()))
                    return p;
            }
        }
    }
    return nullptr;
}